

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWec.h
# Opt level: O0

void Vec_WecPush(Vec_Wec_t *p,int Level,int Entry)

{
  int nCapMin;
  Vec_Int_t *p_00;
  int Entry_local;
  int Level_local;
  Vec_Wec_t *p_local;
  
  if (p->nSize < Level + 1) {
    nCapMin = Abc_MaxInt(p->nSize << 1,Level + 1);
    Vec_WecGrow(p,nCapMin);
    p->nSize = Level + 1;
  }
  p_00 = Vec_WecEntry(p,Level);
  Vec_IntPush(p_00,Entry);
  return;
}

Assistant:

static inline void Vec_WecPush( Vec_Wec_t * p, int Level, int Entry )
{
    if ( p->nSize < Level + 1 )
    {
        Vec_WecGrow( p, Abc_MaxInt(2*p->nSize, Level + 1) );
        p->nSize = Level + 1;
    }
    Vec_IntPush( Vec_WecEntry(p, Level), Entry );
}